

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void FIX::HttpServer::startGlobal(SessionSettings *s)

{
  bool bVar1;
  Dictionary *this;
  HttpServer *this_00;
  allocator<char> local_49;
  string local_48;
  Locker local_18;
  Locker l;
  SessionSettings *s_local;
  
  l.m_mutex = (Mutex *)s;
  Locker::Locker(&local_18,(Mutex *)s_mutex);
  this = SessionSettings::get((SessionSettings *)l.m_mutex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"HttpAcceptPort",&local_49)
  ;
  bVar1 = Dictionary::has(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if ((((bVar1 ^ 0xffU) & 1) == 0) && (s_count = s_count + 1, s_pServer == (HttpServer *)0x0)) {
    this_00 = (HttpServer *)operator_new(0xb0);
    HttpServer(this_00,(SessionSettings *)l.m_mutex);
    s_pServer = this_00;
    start(this_00);
  }
  Locker::~Locker(&local_18);
  return;
}

Assistant:

EXCEPT(ConfigError, RuntimeError) {
  Locker l(s_mutex);

  if (!s.get().has(HTTP_ACCEPT_PORT)) {
    return;
  }

  s_count += 1;
  if (!s_pServer) {
    s_pServer = new HttpServer(s);
    s_pServer->start();
  }
}